

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O0

void __thiscall Dinic::Dinic(Dinic *this,int _N)

{
  int iVar1;
  allocator<int> local_26;
  allocator<int> local_25 [16];
  allocator<std::vector<int,_std::allocator<int>_>_> local_15;
  int local_14;
  Dinic *pDStack_10;
  int _N_local;
  Dinic *this_local;
  
  this->n = _N;
  local_14 = _N;
  pDStack_10 = this;
  std::vector<Edge,_std::allocator<Edge>_>::vector(&this->e);
  iVar1 = this->n;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_15);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->g,(long)iVar1,&local_15);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_15);
  iVar1 = this->n;
  std::allocator<int>::allocator(local_25);
  std::vector<int,_std::allocator<int>_>::vector(&this->d,(long)iVar1,local_25);
  std::allocator<int>::~allocator(local_25);
  iVar1 = this->n;
  std::allocator<int>::allocator(&local_26);
  std::vector<int,_std::allocator<int>_>::vector(&this->pt,(long)iVar1,&local_26);
  std::allocator<int>::~allocator(&local_26);
  return;
}

Assistant:

Dinic(int _N) : n(_N), g(n), d(n), pt(n) {}